

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_trim(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char cVar1;
  undefined8 in_RAX;
  char *zString;
  ushort **ppuVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  jx9_value *pVal;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  int nLen;
  int nListlen;
  undefined8 local_38;
  
  if (nArg < 1) {
    jx9MemObjRelease(pCtx->pRet);
    return 0;
  }
  local_38 = in_RAX;
  zString = jx9_value_to_string(*apArg,(int *)&local_38);
  uVar9 = (ulong)(int)local_38;
  if (0 < (long)uVar9) {
    if (nArg == 1) {
      pcVar7 = zString + uVar9;
      do {
        cVar1 = *zString;
        if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
           ((cVar1 != '\0' &&
            (ppuVar2 = __ctype_b_loc(),
            (*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) == 0)))) goto LAB_001313a8;
        zString = zString + 1;
        uVar8 = (int)uVar9 - 1;
        uVar9 = (ulong)uVar8;
      } while (uVar8 != 0);
      uVar9 = 0;
      zString = pcVar7;
LAB_001313a8:
      local_38._0_4_ = (int)uVar9;
      if ((int)uVar9 != 0) {
        uVar9 = uVar9 & 0xffffffff;
        do {
          local_38._0_4_ = (int)uVar9;
          uVar9 = uVar9 - 1;
          cVar1 = zString[uVar9 & 0xffffffff];
          if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
             ((cVar1 != '\0' &&
              (ppuVar2 = __ctype_b_loc(),
              (*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) == 0)))) goto LAB_001313e2;
        } while ((int)uVar9 != 0);
        local_38._0_4_ = 0;
      }
LAB_001313e2:
      pVal = pCtx->pRet;
      goto LAB_0013145b;
    }
    pcVar7 = jx9_value_to_string(apArg[1],(int *)((long)&local_38 + 4));
    if ((long)(int)local_38._4_4_ < 1) {
      pVal = pCtx->pRet;
      goto LAB_0013145b;
    }
    pcVar3 = zString + (int)local_38;
    pcVar4 = zString;
    do {
      zString = pcVar4;
      if (pcVar3 <= pcVar4) break;
      lVar5 = 0;
      do {
        if (zString < pcVar3) {
          zString = zString + (*zString == pcVar7[lVar5]);
        }
        lVar5 = lVar5 + 1;
      } while ((int)local_38._4_4_ != lVar5);
      bVar10 = zString != pcVar4;
      pcVar4 = zString;
    } while (bVar10);
    uVar9 = 1;
    pcVar4 = pcVar3 + -1;
    if (1 < (int)local_38._4_4_) {
      uVar9 = (ulong)local_38._4_4_;
    }
    do {
      pcVar3 = pcVar4;
      if (pcVar4 <= zString) break;
      uVar6 = 0;
      do {
        if (zString < pcVar3) {
          pcVar3 = pcVar3 + -(ulong)(*pcVar3 == pcVar7[uVar6]);
        }
        uVar6 = uVar6 + 1;
      } while (uVar9 != uVar6);
      bVar10 = pcVar3 != pcVar4;
      pcVar4 = pcVar3;
    } while (bVar10);
    if (zString < pcVar3) {
      local_38._0_4_ = ((int)pcVar3 - (int)zString) + 1;
      pVal = pCtx->pRet;
      goto LAB_0013145b;
    }
  }
  pVal = pCtx->pRet;
  zString = "";
  local_38._0_4_ = 0;
LAB_0013145b:
  jx9_value_string(pVal,zString,(int)local_38);
  return 0;
}

Assistant:

static int jx9Builtin_trim(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string, return */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Start the trim process */
	if( nArg < 2 ){
		SyString sStr;
		/* Remove white spaces and NUL bytes */
		SyStringInitFromBuf(&sStr, zString, nLen);
		SyStringFullTrimSafe(&sStr);
		jx9_result_string(pCtx, sStr.zString, (int)sStr.nByte);
	}else{
		/* Char list */
		const char *zList;
		int nListlen;
		zList = jx9_value_to_string(apArg[1], &nListlen);
		if( nListlen < 1 ){
			/* Return the string unchanged */
			jx9_result_string(pCtx, zString, nLen);
		}else{
			const char *zEnd = &zString[nLen];
			const char *zCur = zString;
			const char *zPtr;
			int i;
			/* Left trim */
			for(;;){
				if( zCur >= zEnd ){
					break;
				}
				zPtr = zCur;
				for( i = 0 ; i < nListlen ; i++ ){
					if( zCur < zEnd && zCur[0] == zList[i] ){
						zCur++;
					}
				}
				if( zCur == zPtr ){
					/* No match, break immediately */
					break;
				}
			}
			/* Right trim */
			zEnd--;
			for(;;){
				if( zEnd <= zCur ){
					break;
				}
				zPtr = zEnd;
				for( i = 0 ; i < nListlen ; i++ ){
					if( zEnd > zCur && zEnd[0] == zList[i] ){
						zEnd--;
					}
				}
				if( zEnd == zPtr ){
					break;
				}
			}
			if( zCur >= zEnd ){
				/* Return the empty string */
				jx9_result_string(pCtx, "", 0);
			}else{
				zEnd++;
				jx9_result_string(pCtx, zCur, (int)(zEnd-zCur));
			}
		}
	}
	return JX9_OK;
}